

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToastOverlay.cpp
# Opt level: O1

void cursespp::ToastOverlay::Show(string *text,int durationMs)

{
  ToastOverlay *this;
  OverlayStack *this_00;
  shared_ptr<cursespp::ToastOverlay> overlay;
  ToastOverlay *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  ILayoutPtr local_28;
  
  this = (ToastOverlay *)operator_new(0x2c8);
  ToastOverlay(this,text,(long)durationMs);
  local_38 = this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<cursespp::ToastOverlay*>
            (&local_30,this);
  std::__shared_ptr<cursespp::ToastOverlay,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<cursespp::ToastOverlay,cursespp::ToastOverlay>
            ((__shared_ptr<cursespp::ToastOverlay,(__gnu_cxx::_Lock_policy)2> *)&local_38,this);
  this_00 = App::Overlays();
  local_28.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &(local_38->super_OverlayBase).super_LayoutBase.super_ILayout;
  if (local_38 == (ToastOverlay *)0x0) {
    local_28.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  local_28.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_30._M_pi;
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
    }
  }
  OverlayStack::Push(this_00,&local_28);
  if (local_28.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  return;
}

Assistant:

void ToastOverlay::Show(const std::string& text, int durationMs) {
    std::shared_ptr<ToastOverlay> overlay(new ToastOverlay(text, durationMs));
    App::Overlays().Push(overlay);
}